

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostzposix.c
# Opt level: O1

int os_get_zoneinfo_key(char *buf,size_t buflen)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  FILE *pFVar6;
  size_t sVar7;
  char *pcVar8;
  char **ppcVar9;
  char *pcVar10;
  void *s1;
  char cVar11;
  bool bVar12;
  unsigned_long mode;
  char linkbuf [4096];
  undefined8 local_1040;
  char local_1038 [4104];
  
  pcVar4 = getenv("TZ");
  if ((pcVar4 == (char *)0x0) || (cVar1 = *pcVar4, cVar1 == '\0')) {
LAB_001f1272:
    pFVar6 = fopen("/etc/timezone","r");
    if (pFVar6 != (FILE *)0x0) {
      pcVar4 = fgets(local_1038,0x100,pFVar6);
      if (pcVar4 != (char *)0x0) {
        sVar7 = strlen(local_1038);
        if ((sVar7 != 0) && (local_1038[sVar7 - 1] == '\n')) {
          local_1038[sVar7 - 1] = '\0';
        }
        if (local_1038[0] != '/') {
          pcVar4 = local_1038;
LAB_001f148b:
          safe_strcpy(buf,buflen,pcVar4);
          fclose(pFVar6);
          return 1;
        }
        pcVar4 = strstr(local_1038,"/zoneinfo/");
        if (pcVar4 != (char *)0x0) {
          pcVar4 = pcVar4 + 10;
          goto LAB_001f148b;
        }
      }
      fclose(pFVar6);
    }
    pFVar6 = fopen("/etc/sysconfig/clock","r");
    if (pFVar6 != (FILE *)0x0) {
      bVar12 = false;
      do {
        pcVar4 = fgets(local_1038,0x100,pFVar6);
        bVar2 = true;
        if (pcVar4 != (char *)0x0) {
          ppuVar5 = __ctype_b_loc();
          s1 = (void *)((long)&local_1040 + 7);
          pcVar4 = local_1038 + 3;
          do {
            pcVar10 = pcVar4;
            pcVar8 = (char *)((long)s1 + 1);
            s1 = (void *)((long)s1 + 1);
            pcVar4 = pcVar10 + 1;
          } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
          iVar3 = memicmp(s1,"zone",4);
          if (iVar3 == 0) {
            do {
              pcVar4 = pcVar10 + 1;
              pcVar10 = pcVar10 + 1;
            } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
            if (*pcVar4 == '=') {
              do {
                pcVar4 = pcVar10 + 1;
                pcVar10 = pcVar10 + 1;
              } while ((*(byte *)((long)*ppuVar5 + (long)*pcVar4 * 2 + 1) & 0x20) != 0);
              if (*pcVar4 == '/') {
                pcVar10 = strstr(pcVar10,"/zoneinfo/");
                if (pcVar10 == (char *)0x0) goto LAB_001f13ee;
                pcVar10 = pcVar10 + 10;
              }
              safe_strcpy(buf,buflen,pcVar10);
              bVar12 = true;
              goto LAB_001f13ee;
            }
          }
          bVar2 = false;
        }
LAB_001f13ee:
      } while (!bVar2);
      fclose(pFVar6);
      if (bVar12) {
        return 1;
      }
    }
    iVar3 = osfmode("/etc/localtime",0,&local_1040,(unsigned_long *)0x0);
    if (iVar3 == 0) {
      return 0;
    }
    if ((local_1040._1_1_ & 0xa0) == 0) {
      return 0;
    }
    iVar3 = os_resolve_symlink("/etc/localtime",local_1038,0x1000);
    if (iVar3 == 0) {
      return 0;
    }
    pcVar4 = strstr(local_1038,"/zoneinfo/");
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
  }
  else {
    bVar12 = true;
    if ((cVar1 != ':') &&
       ((ppuVar5 = __ctype_b_loc(), cVar1 != '/' && (((*ppuVar5)[cVar1] & 0x400) == 0)))) {
      bVar12 = cVar1 == '_';
    }
    cVar11 = pcVar4[1];
    if (cVar11 != '\0') {
      ppuVar5 = __ctype_b_loc();
      pcVar8 = pcVar4 + 2;
      do {
        bVar2 = false;
        if ((*(byte *)((long)*ppuVar5 + (long)cVar11 * 2 + 1) & 4) != 0) {
          bVar2 = bVar12;
        }
        if (cVar11 == '/') {
          bVar2 = bVar12;
        }
        if (cVar11 != '_') {
          bVar12 = bVar2;
        }
        cVar11 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while (cVar11 != '\0');
    }
    if (!bVar12) goto LAB_001f1272;
    if (cVar1 != '/') {
      if (cVar1 != ':') {
        pcVar8 = "/etc/zoneinfo";
        ppcVar9 = os_get_zoneinfo_key::dirs;
        do {
          ppcVar9 = ppcVar9 + 1;
          os_build_full_path(local_1038,0x1000,pcVar8,pcVar4);
          iVar3 = access(local_1038,0);
          pcVar8 = pcVar4;
          if (iVar3 == 0) goto LAB_001f14b1;
          pcVar8 = *ppcVar9;
        } while (pcVar8 != (char *)0x0);
        goto LAB_001f1272;
      }
      pcVar8 = pcVar4 + 1;
      if (*pcVar8 != '/') goto LAB_001f14b1;
    }
    pcVar4 = strstr(pcVar4,"/zoneinfo/");
    if (pcVar4 == (char *)0x0) goto LAB_001f1272;
  }
  pcVar8 = pcVar4 + 10;
LAB_001f14b1:
  safe_strcpy(buf,buflen,pcVar8);
  return 1;
}

Assistant:

int
os_get_zoneinfo_key( char *buf, size_t buflen )
{
    /* First, try the TZ environment variable.  This is used on nearly
     * all Unix-alikes for a per-process timezone setting, although
     * it will only contain a zoneinfo key in newer versions.  There
     * are several possible formats for specifying a zoneinfo key:
     *
     *  TZ=/usr/share/zoneinfo/America/Los_Angeles
     *    - A full absolute path name to a tzinfo file.  We'll sense
     *      this by looking for "/zoneinfo/" in the string, and if we
     *      find it, we'll return the portion after /zoneinfo/.
     *
     *  TZ=America/Los_Angeles
     *    - Just the zoneinfo key, without a path.  If we find a string
     *      that contains all alphabetics, undersores, and slashes, and
     *      has at least one internal slash but doesn't start with a
     *      slash, we probably have a zoneinfo key.  We'll see if we
     *      can find a matching file in the usual zoneinfo database
     *      locations: /etc/zoneinfo, /usr/share/zoneinfo; if we can,
     *      we'll return the key name, otherwise we'll assume this
     *      isn't actually a zoneinfo key but just happens to look like
     *      one in terms of format.
     *
     *  TZ=:America/Los_Angeles
     *  TZ=:/etc/zoneinfo/America/Los_Angeles
     *    - POSIX systems generally use the ":" prefix to signify that
     *      this is a zoneinfo path rather than the old-style "EST5EDT"
     *      type of self-contained zone description.  If we see a colon
     *      prefix with a relative path (properly formed in terms of
     *      its character content), we'll simply assume this is a
     *      zoneinfo key without even checking for an existing file,
     *      since there's not much else it could be.  If we see an
     *      absolute path, we'll search it for /zoneinfo/ and return
     *      the portion after this, again without checking for an
     *      existing file.
     */
    const char *tz = getenv("TZ");
    if (tz != 0 && tz[0] != '\0')
    {
        /* check that the string is formatted like a zoneinfo key */
#define tzcharok(c) (isalpha(c) != 0 || (c) == '/' || (c) == '_')
        int fmt_ok = TRUE;
        const char *p;
        fmt_ok &= (tz[0] == ':' || tzcharok(tz[0]));
        for (p = tz + 1 ; *p != '\0' ; ++p)
            fmt_ok &= tzcharok(*p);

        /* proceed only if it has the right format */
        if (fmt_ok)
        {
            /* check for a leading ':', per POSIX */
            if (tz[0] == ':')
            {
                /* yes, we have a leading ':', so it's almost certainly
                 * a zoneinfo key; if it's an absolute path, find the
                 * part after /zoneinfo/
                 */
                if (tz[1] == '/')
                {
                    /* absolute form - look for /zoneinfo/ */
                    const char *z = strstr(tz, "/zoneinfo/");
                    if (z != 0)
                    {
                        /* found it - return the part after /zoneinfo/ */
                        safe_strcpy(buf, buflen, z + 10);
                        return TRUE;
                    }
                }
                else
                {
                    /* relative path - return as-is minus the colon */
                    safe_strcpy(buf, buflen, tz + 1);
                    return TRUE;
                }
            }
            else
            {
                /* There's no colon, so it *might* be a zoneinfo key.
                 * If it's an absolute path containing /zoneinfo/, it's
                 * a solid bet.  If it's a relative path, look to see
                 * if we can find a file in one of the usual zoneinfo
                 * database locations.
                 */
                if (tz[0] == '/')
                {
                    /* absolute path - check for /zoneinfo/ */
                    const char *z = strstr(tz, "/zoneinfo/");
                    if (z != 0)
                    {
                        /* found it - return the part after /zoneinfo/ */
                        safe_strcpy(buf, buflen, z + 10);
                        return TRUE;
                    }
                }
                else
                {
                    /* relative path - look for a tzinfo file in the
                     * usual locations
                     */
                    static const char *dirs[] = {
                        "/etc/zoneinfo",
                        "/usr/share/zoneinfo",
                        0
                    };
                    const char **dir;
                    for (dir = dirs ; *dir != 0 ; ++dir)
                    {
                        /* build this full path */
                        char fbuf[OSFNMAX];
                        os_build_full_path(fbuf, sizeof(fbuf), *dir, tz);

                        /* check for a file at this location */
                        if (!osfacc(fbuf))
                        {
                            /* got it - looks like a good zoneinfo key */
                            safe_strcpy(buf, buflen, tz);
                            return TRUE;
                        }
                    }
                }
            }
        }
    }

    /* No luck with TZ, so try the system-wide settings next.
     *
     * If a file called /etc/timezone exists, it's usually a one-line
     * text file containing the zoneinfo key.  Read and return its
     * contents.
     */
    FILE *fp;
    if ((fp = fopen("/etc/timezone", "r")) != 0)
    {
        /* read the one-liner */
        char lbuf[256];
        int ok = FALSE;
        if (fgets(lbuf, sizeof(lbuf), fp) != 0)
        {
            /* strip any trailing newline */
            size_t l = strlen(lbuf);
            if (l != 0 && lbuf[l-1] == '\n')
                lbuf[l-1] = '\0';

            /* if it's in absolute format, return the part after
             * /zoneinfo/; otherwise just return the string
             */
            if (lbuf[0] == '/')
            {
                /* absoltue path - find /zoneinfo/ */
                const char *z = strstr(lbuf, "/zoneinfo/");
                if (z != 0)
                {
                    safe_strcpy(buf, buflen, z + 10);
                    ok = TRUE;
                }
            }
            else
            {
                /* relative notation - return it as-is */
                safe_strcpy(buf, buflen, lbuf);
                ok = TRUE;
            }
        }

        /* we're done with the file */
        fclose(fp);

        /* if we got our result, return success */
        if (ok)
            return TRUE;
    }

    /* If /etc/sysconfig/clock exists, read it and look for a line
     * starting with ZONE=.  This contains the zoneinfo key.
     */
    if ((fp = fopen("/etc/sysconfig/clock", "r")) != 0)
    {
        /* scan the file for ZONE=... */
        int ok = FALSE;
        for (;;)
        {
            /* read the next line */
            char lbuf[256];
            if (fgets(lbuf, sizeof(lbuf), fp) == 0)
                break;

            /* skip leading spaces */
            const char *p;
            for (p = lbuf ; isspace(*p) ; ++p) ;

            /* check for ZONE */
            if (memicmp(p, "zone", 4) != 0)
                continue;

            /* skip spaces after ZONE */
            for (p += 4 ; isspace(*p) ; ++p) ;

            /* check for '=' */
            if (*p != '=')
                continue;

            /* skip spaces after the '=' */
            for (++p ; isspace(*p) ; ++p) ;

            /* if it's in absolute form, look for /zoneinfo/ */
            if (*p == '/')
            {
                const char *z = strstr(p, "/zoneinfo/");
                if (z != 0)
                {
                    safe_strcpy(buf, buflen, z + 10);
                    ok = TRUE;
                }
            }
            else
            {
                /* relative notation - it's the zoneinfo key */
                safe_strcpy(buf, buflen, p);
                ok = TRUE;
            }

            /* that's our ZONE line, so we're done scanning the file */
            break;
        }

        /* done with the file */
        fclose(fp);

        /* if we got our result, return success */
        if (ok)
            return TRUE;
    }

    /* If /etc/localtime is a symbolic link, the linked file is the
     * actual zoneinfo file.  Resolve the link and return the portion
     * of the path after "/zoneinfo/".
     */
    static const char *elt = "/etc/localtime";
    unsigned long mode;
    char linkbuf[OSFNMAX];
    const char *zi;
    if (osfmode(elt, FALSE, &mode, NULL)
        && (mode & OSFMODE_LINK) != 0
        && os_resolve_symlink(elt, linkbuf, sizeof(linkbuf))
        && (zi = strstr(linkbuf, "/zoneinfo/")) != 0)
    {
        /* it's a link containing /zoneinfo/, so return the portion
         * after /zoneinfo/
         */
        safe_strcpy(buf, buflen, zi + 10);
        return TRUE;
    }

    /* well, we're out of ideas - return failure */
    return FALSE;
}